

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# one-of.h
# Opt level: O3

void __thiscall
kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>::destroy
          (OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect> *this)

{
  long *plVar1;
  undefined8 *puVar2;
  uint uVar3;
  
  uVar3 = this->tag;
  if (uVar3 == 1) {
    this->tag = 0;
    plVar1 = *(long **)((long)&this->field_1 + 0x28);
    if (plVar1 == (long *)0x0) {
      return;
    }
    *(undefined8 *)((long)&this->field_1 + 0x28) = 0;
    puVar2 = *(undefined8 **)((long)&this->field_1 + 0x20);
    (**(code **)*puVar2)(puVar2,(long)plVar1 + *(long *)(*plVar1 + -0x10));
    uVar3 = this->tag;
  }
  if (uVar3 == 2) {
    this->tag = 0;
    plVar1 = *(long **)((long)&this->field_1 + 0x20);
    if (plVar1 != (long *)0x0) {
      *(undefined8 *)((long)&this->field_1 + 0x20) = 0;
      puVar2 = *(undefined8 **)((long)&this->field_1 + 0x18);
      (**(code **)*puVar2)(puVar2,(long)plVar1 + *(long *)(*plVar1 + -0x10));
      return;
    }
  }
  return;
}

Assistant:

void destroy() {
    doAll(destroyVariant<Variants>()...);
  }